

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int glslang::TIntermediate::getBaseAlignment
              (TType *type,int *size,int *stride,TLayoutPacking layoutPacking,bool rowMajor)

{
  TTypeList *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pTVar5;
  long lVar6;
  bool rowMajor_00;
  ulong uVar7;
  long lVar8;
  int dummyStride;
  TType derefType;
  int local_cc;
  TType local_c8;
  
  *stride = 0;
  iVar2 = (*type->_vptr_TType[0x1d])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if ((iVar2 == 0xf) || (iVar2 = (*type->_vptr_TType[7])(type), iVar2 == 0x10)) {
      iVar2 = (*type->_vptr_TType[0x25])(type);
      if ((char)iVar2 != '\0') {
        pTVar1 = (type->field_13).structure;
        *size = 0;
        iVar2 = (uint)(layoutPacking == ElpStd140) << 4;
        pTVar5 = (pTVar1->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish != pTVar5) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            lVar6 = (**(code **)(**(long **)((long)&pTVar5->type + lVar8) + 0x50))();
            rowMajor_00 = (*(ulong *)(lVar6 + 8) & 0xe000000000000000) == 0x2000000000000000;
            if (*(ulong *)(lVar6 + 8) < 0x2000000000000000) {
              rowMajor_00 = rowMajor;
            }
            iVar3 = getBaseAlignment(*(TType **)
                                      ((long)&((pTVar1->
                                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                               ).
                                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->type +
                                      lVar8),(int *)&local_c8,&local_cc,layoutPacking,rowMajor_00);
            if (iVar2 <= iVar3) {
              iVar2 = iVar3;
            }
            RoundToPow2<int>(size,iVar3);
            *size = *size + (int)local_c8._vptr_TType;
            uVar7 = uVar7 + 1;
            pTVar5 = (pTVar1->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 0x20;
          } while (uVar7 < (ulong)((long)(pTVar1->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5
                                  >> 5));
        }
        RoundToPow2<int>(size,iVar2);
        return iVar2;
      }
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    iVar2 = (*type->_vptr_TType[0x18])(type);
    if ((char)iVar2 != '\0') {
      iVar2 = getBaseAlignmentScalar(type,size);
      return iVar2;
    }
    iVar2 = (*type->_vptr_TType[0x1b])(type);
    if ((char)iVar2 != '\0') {
      iVar2 = getBaseAlignmentScalar(type,size);
      iVar3 = (*type->_vptr_TType[0xc])(type);
      if (iVar3 == 1) {
        return iVar2;
      }
      if (iVar3 == 2) {
        *size = *size << 1;
        return iVar2 * 2;
      }
      iVar3 = (*type->_vptr_TType[0xc])(type);
      *size = iVar3 * *size;
      return iVar2 << 2;
    }
    iVar2 = (*type->_vptr_TType[0x1c])(type);
    if ((char)iVar2 == '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                    ,0x931,
                    "static int glslang::TIntermediate::getBaseAlignment(const TType &, int &, int &, TLayoutPacking, bool)"
                   );
    }
    TType::TType(&local_c8,type,0,rowMajor);
    iVar3 = getBaseAlignment(&local_c8,size,&local_cc,layoutPacking,rowMajor);
    iVar2 = 0x10;
    if (0x10 < iVar3) {
      iVar2 = iVar3;
    }
    if (layoutPacking != ElpStd140) {
      iVar2 = iVar3;
    }
    RoundToPow2<int>(size,iVar2);
    iVar3 = *size;
    *stride = iVar3;
    iVar4 = (*type->_vptr_TType[(ulong)rowMajor + 0xd])(type);
    iVar4 = iVar4 * iVar3;
  }
  else {
    TType::TType(&local_c8,type,0,false);
    iVar3 = getBaseAlignment(&local_c8,size,&local_cc,layoutPacking,rowMajor);
    iVar2 = 0x10;
    if (0x10 < iVar3) {
      iVar2 = iVar3;
    }
    if (layoutPacking != ElpStd140) {
      iVar2 = iVar3;
    }
    RoundToPow2<int>(size,iVar2);
    *stride = *size;
    iVar3 = (*type->_vptr_TType[0x1f])(type);
    if (((char)iVar3 == '\0') || (iVar3 = (*type->_vptr_TType[0xf])(type), iVar3 != 0)) {
      iVar4 = (*type->_vptr_TType[0xf])(type);
    }
    else {
      iVar4 = 1;
    }
    iVar4 = iVar4 * *stride;
  }
  *size = iVar4;
  return iVar2;
}

Assistant:

int TIntermediate::getBaseAlignment(const TType& type, int& size, int& stride, TLayoutPacking layoutPacking, bool rowMajor)
{
    int alignment;

    bool std140 = layoutPacking == glslang::ElpStd140;
    // When using the std140 storage layout, structures will be laid out in buffer
    // storage with its members stored in monotonically increasing order based on their
    // location in the declaration. A structure and each structure member have a base
    // offset and a base alignment, from which an aligned offset is computed by rounding
    // the base offset up to a multiple of the base alignment. The base offset of the first
    // member of a structure is taken from the aligned offset of the structure itself. The
    // base offset of all other structure members is derived by taking the offset of the
    // last basic machine unit consumed by the previous member and adding one. Each
    // structure member is stored in memory at its aligned offset. The members of a top-
    // level uniform block are laid out in buffer storage by treating the uniform block as
    // a structure with a base offset of zero.
    //
    //   1. If the member is a scalar consuming N basic machine units, the base alignment is N.
    //
    //   2. If the member is a two- or four-component vector with components consuming N basic
    //      machine units, the base alignment is 2N or 4N, respectively.
    //
    //   3. If the member is a three-component vector with components consuming N
    //      basic machine units, the base alignment is 4N.
    //
    //   4. If the member is an array of scalars or vectors, the base alignment and array
    //      stride are set to match the base alignment of a single array element, according
    //      to rules (1), (2), and (3), and rounded up to the base alignment of a vec4. The
    //      array may have padding at the end; the base offset of the member following
    //      the array is rounded up to the next multiple of the base alignment.
    //
    //   5. If the member is a column-major matrix with C columns and R rows, the
    //      matrix is stored identically to an array of C column vectors with R
    //      components each, according to rule (4).
    //
    //   6. If the member is an array of S column-major matrices with C columns and
    //      R rows, the matrix is stored identically to a row of S X C column vectors
    //      with R components each, according to rule (4).
    //
    //   7. If the member is a row-major matrix with C columns and R rows, the matrix
    //      is stored identically to an array of R row vectors with C components each,
    //      according to rule (4).
    //
    //   8. If the member is an array of S row-major matrices with C columns and R
    //      rows, the matrix is stored identically to a row of S X R row vectors with C
    //      components each, according to rule (4).
    //
    //   9. If the member is a structure, the base alignment of the structure is N , where
    //      N is the largest base alignment value of any    of its members, and rounded
    //      up to the base alignment of a vec4. The individual members of this substructure
    //      are then assigned offsets by applying this set of rules recursively,
    //      where the base offset of the first member of the sub-structure is equal to the
    //      aligned offset of the structure. The structure may have padding at the end;
    //      the base offset of the member following the sub-structure is rounded up to
    //      the next multiple of the base alignment of the structure.
    //
    //   10. If the member is an array of S structures, the S elements of the array are laid
    //       out in order, according to rule (9).
    //
    //   Assuming, for rule 10:  The stride is the same as the size of an element.

    stride = 0;
    int dummyStride;

    // rules 4, 6, 8, and 10
    if (type.isArray()) {
        // TODO: perf: this might be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        TType derefType(type, 0);
        alignment = getBaseAlignment(derefType, size, dummyStride, layoutPacking, rowMajor);
        if (std140)
            alignment = std::max(baseAlignmentVec4Std140, alignment);
        RoundToPow2(size, alignment);
        stride = size;  // uses full matrix size for stride of an array of matrices (not quite what rule 6/8, but what's expected)
                        // uses the assumption for rule 10 in the comment above
        // use one element to represent the last member of SSBO which is unsized array
        int arraySize = (type.isUnsizedArray() && (type.getOuterArraySize() == 0)) ? 1 : type.getOuterArraySize();
        size = stride * arraySize;
        return alignment;
    }

    // rule 9
    if (type.getBasicType() == EbtStruct || type.getBasicType() == EbtBlock) {
        const TTypeList& memberList = *type.getStruct();

        size = 0;
        int maxAlignment = std140 ? baseAlignmentVec4Std140 : 0;
        for (size_t m = 0; m < memberList.size(); ++m) {
            int memberSize;
            // modify just the children's view of matrix layout, if there is one for this member
            TLayoutMatrix subMatrixLayout = memberList[m].type->getQualifier().layoutMatrix;
            int memberAlignment = getBaseAlignment(*memberList[m].type, memberSize, dummyStride, layoutPacking,
                                                   (subMatrixLayout != ElmNone) ? (subMatrixLayout == ElmRowMajor) : rowMajor);
            maxAlignment = std::max(maxAlignment, memberAlignment);
            RoundToPow2(size, memberAlignment);
            size += memberSize;
        }

        // The structure may have padding at the end; the base offset of
        // the member following the sub-structure is rounded up to the next
        // multiple of the base alignment of the structure.
        RoundToPow2(size, maxAlignment);

        return maxAlignment;
    }

    // rule 1
    if (type.isScalar())
        return getBaseAlignmentScalar(type, size);

    // rules 2 and 3
    if (type.isVector()) {
        int scalarAlign = getBaseAlignmentScalar(type, size);
        switch (type.getVectorSize()) {
        case 1: // HLSL has this, GLSL does not
            return scalarAlign;
        case 2:
            size *= 2;
            return 2 * scalarAlign;
        default:
            size *= type.getVectorSize();
            return 4 * scalarAlign;
        }
    }

    // rules 5 and 7
    if (type.isMatrix()) {
        // rule 5: deref to row, not to column, meaning the size of vector is num columns instead of num rows
        TType derefType(type, 0, rowMajor);

        alignment = getBaseAlignment(derefType, size, dummyStride, layoutPacking, rowMajor);
        if (std140)
            alignment = std::max(baseAlignmentVec4Std140, alignment);
        RoundToPow2(size, alignment);
        stride = size;  // use intra-matrix stride for stride of a just a matrix
        if (rowMajor)
            size = stride * type.getMatrixRows();
        else
            size = stride * type.getMatrixCols();

        return alignment;
    }

    assert(0);  // all cases should be covered above
    size = baseAlignmentVec4Std140;
    return baseAlignmentVec4Std140;
}